

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss.h
# Opt level: O3

string * __thiscall
xLearn::SquaredLoss::loss_type_abi_cxx11_(string *__return_storage_ptr__,SquaredLoss *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"mse_loss","");
  return __return_storage_ptr__;
}

Assistant:

std::string loss_type() { return "mse_loss"; }